

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

void __thiscall
CUI::DoLabelSelected(CUI *this,CUIRect *pRect,char *pText,bool Selected,float FontSize,int Align)

{
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,Selected) != 0) {
    ITextRender::TextColor(this->m_pTextRender,&ms_HighlightTextColor);
    ITextRender::TextSecondaryColor(this->m_pTextRender,&ms_HighlightTextOutlineColor);
    DoLabel(this,pRect,pText,FontSize,Align,-1.0,true);
    ITextRender::TextColor(this->m_pTextRender,&ms_DefaultTextColor);
    ITextRender::TextSecondaryColor(this->m_pTextRender,&ms_DefaultTextOutlineColor);
    return;
  }
  DoLabel(this,pRect,pText,FontSize,Align,-1.0,true);
  return;
}

Assistant:

void CUI::DoLabelSelected(const CUIRect *pRect, const char *pText, bool Selected, float FontSize, int Align)
{
	if(Selected)
	{
		TextRender()->TextColor(CUI::ms_HighlightTextColor);
		TextRender()->TextSecondaryColor(CUI::ms_HighlightTextOutlineColor);
	}
	DoLabel(pRect, pText, FontSize, Align);
	if(Selected)
	{
		TextRender()->TextColor(CUI::ms_DefaultTextColor);
		TextRender()->TextSecondaryColor(CUI::ms_DefaultTextOutlineColor);
	}
}